

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseFloatLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *this)

{
  long *__nptr;
  UnicodeChar UVar1;
  UnicodeChar UVar2;
  int *piVar3;
  TokenType TVar4;
  undefined8 uVar5;
  int iVar6;
  UTF8Reader UVar7;
  double dVar8;
  UTF8Reader t;
  UTF8Reader local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  local_60.data = (this->input).data;
  iVar6 = 0;
  if ((byte)(*local_60.data - 0x30U) < 10) {
    iVar6 = 0;
    do {
      UTF8Reader::operator++(&local_60);
      iVar6 = iVar6 + 1;
    } while ((byte)(*local_60.data - 0x30U) < 10);
  }
  UVar7.data = local_60.data;
  UVar1 = UTF8Reader::operator*(&local_60);
  if (UVar1 == 0x2e) {
    iVar6 = iVar6 + -1;
    do {
      UTF8Reader::operator++(&local_60);
      iVar6 = iVar6 + 1;
      UVar7.data = local_60.data;
    } while ((byte)(*local_60.data - 0x30U) < 10);
  }
  if (iVar6 != 0) {
    UVar2 = UTF8Reader::operator*(&local_60);
    if ((UVar2 & 0xffffffdf) == 0x45) {
      UTF8Reader::operator++(&local_60);
      UVar1 = UTF8Reader::operator*(&local_60);
      if ((UVar1 == 0x2d) || (UVar1 == 0x2b)) {
        UTF8Reader::operator++(&local_60);
      }
      if (9 < (byte)(*local_60.data - 0x30U)) {
        return false;
      }
      do {
        UTF8Reader::operator++(&local_60);
        UVar7.data = local_60.data;
      } while ((byte)(*local_60.data - 0x30U) < 10);
    }
    else if (UVar1 != 0x2e) {
      return false;
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,(this->input).data,UVar7.data);
    __nptr = local_58[0];
    piVar3 = __errno_location();
    iVar6 = *piVar3;
    *piVar3 = 0;
    dVar8 = strtod((char *)__nptr,(char **)&local_38);
    if (local_38 == __nptr) {
      uVar5 = std::__throw_invalid_argument("stod");
      if (*piVar3 == 0) {
        *piVar3 = iVar6;
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      _Unwind_Resume(uVar5);
    }
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stod");
      return false;
    }
    this->literalDoubleValue = dVar8;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    (this->input).data = local_60.data;
    TVar4 = parseSuffixForFloatLiteral(this);
    (this->literalType).text = TVar4.text;
    checkCharacterImmediatelyAfterLiteral(this);
    return true;
  }
  return false;
}

Assistant:

bool parseFloatLiteral()
    {
        int numDigits = 0;
        auto t = input;
        while (t.isDigit())  { ++t; ++numDigits; }

        const bool hasPoint = (*t == '.');

        if (hasPoint)
            while ((++t).isDigit())  ++numDigits;

        if (numDigits == 0)
            return false;

        auto c = *t;
        const bool hasExponent = (c == 'e' || c == 'E');

        if (hasExponent)
        {
            c = *++t;
            if (c == '+' || c == '-')  ++t;
            if (! t.isDigit()) return false;
            while ((++t).isDigit()) {}
        }

        if (! (hasExponent || hasPoint))
            return false;

        literalDoubleValue = std::stod (std::string (input.getAddress(), t.getAddress()));
        input = t;
        literalType = parseSuffixForFloatLiteral();
        checkCharacterImmediatelyAfterLiteral();
        return true;
    }